

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O2

bool peparse::parse_resource_id(bounded_buffer *data,uint32_t id,string *result)

{
  bool bVar1;
  uint uVar2;
  bool bVar3;
  uint16_t len;
  UCharString rawString;
  char16_t c;
  ushort local_7a;
  string *local_78;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_70;
  string local_50;
  
  bVar1 = readWord(data,id,&local_7a);
  uVar2 = 0;
  bVar3 = false;
  if (bVar1) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = L'\0';
    local_78 = result;
    for (; bVar3 = (uint)local_7a * 2 <= uVar2, !bVar3; uVar2 = uVar2 + 2) {
      bVar1 = readChar16(data,id + 2 + uVar2,(char16_t *)&local_50);
      if (!bVar1) goto LAB_00110de6;
      std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
      push_back(&local_70,(char16_t)local_50._M_dataplus._M_p);
    }
    from_utf16(&local_50,&local_70);
    std::__cxx11::string::operator=((string *)local_78,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
LAB_00110de6:
    std::__cxx11::u16string::~u16string((u16string *)&local_70);
  }
  return bVar3;
}

Assistant:

bool parse_resource_id(bounded_buffer *data,
                       std::uint32_t id,
                       std::string &result) {
  std::uint16_t len;
  if (!readWord(data, id, len)) {
    return false;
  }
  id += 2;

  std::uint32_t rawSize = len * 2U;
  UCharString rawString;
  for (std::uint32_t i = 0; i < rawSize; i += 2) {
    char16_t c;
    if (!readChar16(data, id + i, c)) {
      return false;
    }
    rawString.push_back(c);
  }

  result = from_utf16(rawString);
  return true;
}